

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::GetTapBranchInfoRequest::ConvertFromStruct
          (GetTapBranchInfoRequest *this,GetTapBranchInfoRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->tree_string_);
  std::__cxx11::string::_M_assign((string *)&this->tapscript_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->nodes_,&data->nodes);
  this->index_ = data->index;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void GetTapBranchInfoRequest::ConvertFromStruct(
    const GetTapBranchInfoRequestStruct& data) {
  tree_string_ = data.tree_string;
  tapscript_ = data.tapscript;
  nodes_.ConvertFromStruct(data.nodes);
  index_ = data.index;
  ignore_items = data.ignore_items;
}